

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O0

Ref<embree::XML>
embree::parseXML(Ref<embree::Stream<int>_> *chars,string *id,bool hasHeader,bool hasTail)

{
  byte bVar1;
  pointer pbVar2;
  runtime_error *this;
  Token *this_00;
  byte in_CL;
  Stream<embree::Token> *in_RSI;
  XML *in_RDI;
  byte in_R8B;
  Ref<embree::Stream<embree::Token>_> cin;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  symbols;
  Ref<embree::XML> *xml;
  size_t in_stack_00000740;
  Ref<embree::Stream<embree::Token>_> *in_stack_00000748;
  Token *in_stack_fffffffffffffc18;
  Token *in_stack_fffffffffffffc20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc48;
  string *in_stack_fffffffffffffc50;
  string *in_stack_fffffffffffffc58;
  undefined7 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc67;
  TokenStream *in_stack_fffffffffffffc68;
  ParseLocation *this_02;
  string local_2e0 [111];
  undefined1 local_271;
  long *local_270;
  undefined1 local_261;
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  undefined1 local_200 [16];
  string local_1f0 [39];
  allocator local_1c9;
  Ref<embree::Stream<embree::Token>_> *in_stack_fffffffffffffe38;
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [24];
  Ref<embree::Stream<embree::Token>_> *in_stack_fffffffffffffef0;
  allocator local_101;
  string local_100 [39];
  undefined1 local_d9 [56];
  allocator local_a1;
  string local_a0 [62];
  byte local_62;
  byte local_61;
  undefined1 *local_48;
  undefined1 *local_40;
  long **local_38;
  pointer local_20;
  undefined1 *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  
  local_61 = in_CL & 1;
  local_62 = in_R8B & 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x41e445);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"<!--",&local_a1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffc20,(value_type *)in_stack_fffffffffffffc18);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  this_02 = (ParseLocation *)local_d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_d9 + 1),"-->",(allocator *)this_02);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffc20,(value_type *)in_stack_fffffffffffffc18);
  std::__cxx11::string::~string((string *)(local_d9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"<?",&local_101);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffc20,(value_type *)in_stack_fffffffffffffc18);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"?>",&local_129);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffc20,(value_type *)in_stack_fffffffffffffc18);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"</",&local_151);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffc20,(value_type *)in_stack_fffffffffffffc18);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"/>",&local_179);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffc20,(value_type *)in_stack_fffffffffffffc18);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"<",&local_1a1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffc20,(value_type *)in_stack_fffffffffffffc18);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffe38,">",&local_1c9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffc20,(value_type *)in_stack_fffffffffffffc18);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe38);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"=",(allocator *)(local_200 + 0xf));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffc20,(value_type *)in_stack_fffffffffffffc18);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)(local_200 + 0xf));
  pbVar2 = (pointer)::operator_new(0x360);
  local_261 = 1;
  std::operator+(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  std::operator+(in_stack_fffffffffffffc28,(char *)in_stack_fffffffffffffc20);
  std::operator+(in_stack_fffffffffffffc28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc20);
  TokenStream::TokenStream
            (in_stack_fffffffffffffc68,
             (Ref<embree::Stream<int>_> *)
             CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),in_stack_fffffffffffffc58
             ,in_stack_fffffffffffffc50,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffc48);
  local_261 = 0;
  local_18 = local_200;
  local_20 = pbVar2;
  local_200._0_8_ = pbVar2;
  if (pbVar2 != (pointer)0x0) {
    (**(code **)(*(long *)pbVar2 + 0x10))();
  }
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::~string(local_260);
  if ((local_61 & 1) != 0) {
    parseHeader(in_stack_fffffffffffffef0);
    local_38 = &local_270;
    if (local_270 != (long *)0x0) {
      (**(code **)(*local_270 + 0x18))();
    }
  }
  parseComments(in_stack_fffffffffffffe38);
  local_271 = 0;
  parseXML(in_stack_00000748,in_stack_00000740);
  parseComments(in_stack_fffffffffffffe38);
  if ((local_62 & 1) == 0) {
    local_40 = local_200;
    Stream<embree::Token>::peek(in_RSI);
    Token::Eof();
    bVar1 = operator!=(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    Token::~Token(in_stack_fffffffffffffc20);
    if ((bVar1 & 1) != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      local_48 = local_200;
      this_00 = Stream<embree::Token>::peek(in_RSI);
      Token::Location(this_00);
      ParseLocation::str_abi_cxx11_(this_02);
      std::operator+(in_stack_fffffffffffffc28,(char *)in_stack_fffffffffffffc20);
      std::runtime_error::runtime_error(this,local_2e0);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  local_271 = 1;
  this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_200;
  local_10 = this_01;
  if ((pointer)local_200._0_8_ != (pointer)0x0) {
    (**(code **)(*(long *)local_200._0_8_ + 0x18))();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this_01);
  return (Ref<embree::XML>)in_RDI;
}

Assistant:

Ref<XML> parseXML(Ref<Stream<int> > chars, std::string id, bool hasHeader = true, bool hasTail = false)
  {
    /* create lexer for XML file */
    std::vector<std::string> symbols;
    symbols.push_back("<!--");
    symbols.push_back("-->");
    symbols.push_back("<?");
    symbols.push_back("?>");
    symbols.push_back("</");
    symbols.push_back("/>");
    symbols.push_back("<");
    symbols.push_back(">");
    symbols.push_back("=");
    Ref<Stream<Token> > cin = new TokenStream(chars,TokenStream::alpha + TokenStream::ALPHA + "_" + id, TokenStream::separators, symbols);

    if (hasHeader) parseHeader(cin);
    parseComments(cin);
    Ref<XML> xml = parseXML(cin,0);
    parseComments(cin);

    if (!hasTail)
      if (cin->peek() != Token::Eof()) THROW_RUNTIME_ERROR(cin->peek().Location().str()+": end of file expected");

    return xml;
  }